

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArticulatedPart.cpp
# Opt level: O2

void __thiscall KDIS::DATA_TYPE::ArticulatedPart::Encode(ArticulatedPart *this,KDataStream *stream)

{
  KDataStream::Write(stream,(this->super_VariableParameter).m_ui8VarParamType);
  KDataStream::Write(stream,this->m_ui8ParmeterChange);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16AttachementID);
  KDataStream::Write<unsigned_int>(stream,this->m_ui32ParamTypeVariant);
  KDataStream::Write<float>(stream,(float)this->m_f32ParamValue);
  KDataStream::Write<unsigned_int>(stream,this->m_ui32Padding);
  return;
}

Assistant:

void ArticulatedPart::Encode( KDataStream & stream ) const
{
    stream << m_ui8VarParamType
           << m_ui8ParmeterChange
           << m_ui16AttachementID
           << m_ui32ParamTypeVariant
           << m_f32ParamValue
           << m_ui32Padding;
}